

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O0

exr_result_t exr_attr_list_compute_size(exr_context_t ctxt,exr_attribute_list_t *list,uint64_t *out)

{
  long lVar1;
  exr_context_t ctxt_00;
  undefined8 uVar2;
  undefined8 uVar3;
  exr_result_t eVar4;
  void **packed;
  long *in_RDX;
  int *in_RSI;
  long in_RDI;
  int32_t sz;
  int s;
  int c;
  exr_attribute_t *cur;
  int i;
  exr_result_t rv;
  uint64_t retval;
  uint in_stack_ffffffffffffffb8;
  int iVar5;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_30;
  long local_28;
  exr_result_t local_4;
  
  local_28 = 0;
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (int *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Missing list to compute size");
  }
  else if (in_RDX == (long *)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Expected output pointer");
  }
  else {
    *in_RDX = 0;
    for (local_30 = 0; local_30 < *in_RSI; local_30 = local_30 + 1) {
      ctxt_00 = *(exr_context_t *)(*(long *)(in_RSI + 2) + (long)local_30 * 8);
      lVar1 = (ulong)*(byte *)((long)&(ctxt_00->filename).str + 1) +
              (ulong)*(byte *)&(ctxt_00->filename).str + local_28;
      local_28 = lVar1 + 6;
      packed = (void **)(ulong)*(uint *)((long)&(ctxt_00->filename).str + 4);
      switch(packed) {
      case (void **)0x0:
      case (void **)0x1f:
      default:
        uVar2._0_4_ = (ctxt_00->filename).length;
        uVar2._4_4_ = (ctxt_00->filename).alloc_size;
        uVar3._0_1_ = ctxt_00->mode;
        uVar3._1_1_ = ctxt_00->version;
        uVar3._2_1_ = ctxt_00->max_name_length;
        uVar3._3_1_ = ctxt_00->is_singlepart_tiled;
        uVar3._4_1_ = ctxt_00->has_nonimage_data;
        uVar3._5_1_ = ctxt_00->is_multipart;
        uVar3._6_1_ = ctxt_00->strict_header;
        uVar3._7_1_ = ctxt_00->silent_header;
        eVar4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,
                           "Invalid / unhandled type \'%s\' for attribute \'%s\', unable to compute size"
                           ,uVar2,uVar3);
        return eVar4;
      case (void **)0x1:
        local_28 = lVar1 + 0x16;
        break;
      case (void **)0x2:
        local_28 = lVar1 + 0x16;
        break;
      case (void **)0x3:
        for (in_stack_ffffffffffffffc4 = 0;
            in_stack_ffffffffffffffc4 < **(int **)&ctxt_00->tmp_filename;
            in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          local_28 = *(int *)(*(long *)(*(long *)&ctxt_00->tmp_filename + 8) +
                             (long)in_stack_ffffffffffffffc4 * 0x20) + local_28 + 0x11;
        }
        break;
      case (void **)0x4:
        local_28 = lVar1 + 0x26;
        break;
      case (void **)0x5:
      case (void **)0x7:
      case (void **)0xc:
        local_28 = lVar1 + 7;
        break;
      case (void **)0x6:
        local_28 = lVar1 + 0xe;
        break;
      case (void **)0x8:
        local_28 = lVar1 + 10;
        break;
      case (void **)0x9:
        local_28 = (long)**(int **)&ctxt_00->tmp_filename * 4 + local_28;
        break;
      case (void **)0xa:
        local_28 = lVar1 + 10;
        break;
      case (void **)0xb:
        local_28 = lVar1 + 0x22;
        break;
      case (void **)0xd:
        local_28 = lVar1 + 0x2a;
        break;
      case (void **)0xe:
        local_28 = lVar1 + 0x4e;
        break;
      case (void **)0xf:
        local_28 = lVar1 + 0x46;
        break;
      case (void **)0x10:
        local_28 = lVar1 + 0x86;
        break;
      case (void **)0x11:
        local_28 = (ulong)**(uint **)&ctxt_00->tmp_filename *
                   (ulong)*(uint *)(*(long *)&ctxt_00->tmp_filename + 4) * 4 + local_28;
        break;
      case (void **)0x12:
        local_28 = lVar1 + 0xe;
        break;
      case (void **)0x13:
        local_28 = **(int **)&ctxt_00->tmp_filename + local_28;
        break;
      case (void **)0x14:
        for (in_stack_ffffffffffffffc0 = 0;
            in_stack_ffffffffffffffc0 < **(int **)&ctxt_00->tmp_filename;
            in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
          local_28 = *(int *)(*(long *)(*(long *)&ctxt_00->tmp_filename + 8) +
                             (long)in_stack_ffffffffffffffc0 * 0x10) + local_28 + 4;
        }
        break;
      case (void **)0x15:
        local_28 = lVar1 + 0xf;
        break;
      case (void **)0x16:
        local_28 = lVar1 + 0xe;
        break;
      case (void **)0x17:
        local_28 = lVar1 + 0xe;
        break;
      case (void **)0x18:
        local_28 = lVar1 + 0xe;
        break;
      case (void **)0x19:
        local_28 = lVar1 + 0x16;
        break;
      case (void **)0x1a:
        local_28 = lVar1 + 0x12;
        break;
      case (void **)0x1b:
        local_28 = lVar1 + 0x12;
        break;
      case (void **)0x1c:
        local_28 = lVar1 + 0x1e;
        break;
      case (void **)0x1d:
        local_28 = lVar1 + 7;
        break;
      case (void **)0x1e:
        if (*(long *)(*(long *)&ctxt_00->tmp_filename + 0x10) == 0) {
          if (*(long *)(*(long *)&ctxt_00->tmp_filename + 0x18) != 0) {
            iVar5 = 0;
            eVar4 = exr_attr_opaquedata_pack
                              (ctxt_00,(exr_attr_opaquedata_t *)
                                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ,(int32_t *)(ulong)in_stack_ffffffffffffffb8,packed);
            if (eVar4 != 0) {
              return eVar4;
            }
            local_28 = iVar5 + local_28;
          }
        }
        else {
          local_28 = **(int **)&ctxt_00->tmp_filename + local_28;
        }
      }
    }
    *in_RDX = local_28;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_list_compute_size (
    exr_context_t ctxt, exr_attribute_list_t* list, uint64_t* out)
{
    uint64_t     retval = 0;
    exr_result_t rv     = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!list)
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Missing list to compute size");

    if (!out)
        return ctxt->report_error (
            ctxt, EXR_ERR_INVALID_ARGUMENT, "Expected output pointer");

    *out = 0;
    for (int i = 0; i < list->num_attributes; ++i)
    {
        const exr_attribute_t* cur = list->entries[i];
        retval += (size_t) cur->name_length + 1;
        retval += (size_t) cur->type_name_length + 1;
        retval += sizeof (int32_t);
        switch (cur->type)
        {
            case EXR_ATTR_BOX2I: retval += sizeof (*(cur->box2i)); break;
            case EXR_ATTR_BOX2F: retval += sizeof (*(cur->box2f)); break;
            case EXR_ATTR_CHLIST:
                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    retval += (size_t) cur->chlist->entries[c].name.length + 1;
                    retval += sizeof (int32_t) * 4;
                }
                break;
            case EXR_ATTR_CHROMATICITIES:
                retval += sizeof (*(cur->chromaticities));
                break;
            case EXR_ATTR_COMPRESSION:
            case EXR_ATTR_ENVMAP:
            case EXR_ATTR_LINEORDER: retval += sizeof (uint8_t); break;
            case EXR_ATTR_DOUBLE: retval += sizeof (double); break;
            case EXR_ATTR_FLOAT: retval += sizeof (float); break;
            case EXR_ATTR_FLOAT_VECTOR:
                retval += sizeof (float) * (size_t) (cur->floatvector->length);
                break;
            case EXR_ATTR_INT: retval += sizeof (int32_t); break;
            case EXR_ATTR_KEYCODE: retval += sizeof (*(cur->keycode)); break;
            case EXR_ATTR_M33F: retval += sizeof (*(cur->m33f)); break;
            case EXR_ATTR_M33D: retval += sizeof (*(cur->m33d)); break;
            case EXR_ATTR_M44F: retval += sizeof (*(cur->m44f)); break;
            case EXR_ATTR_M44D: retval += sizeof (*(cur->m44d)); break;
            case EXR_ATTR_PREVIEW:
                retval += (size_t) cur->preview->width *
                          (size_t) cur->preview->height * (size_t) 4;
                break;
            case EXR_ATTR_RATIONAL: retval += sizeof (*(cur->rational)); break;
            case EXR_ATTR_STRING: retval += (size_t) cur->string->length; break;
            case EXR_ATTR_STRING_VECTOR:
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    retval += (size_t) cur->stringvector->strings[s].length;
                    retval += sizeof (int32_t);
                }
                break;
            case EXR_ATTR_TILEDESC: retval += sizeof (*(cur->tiledesc)); break;
            case EXR_ATTR_TIMECODE: retval += sizeof (*(cur->timecode)); break;
            case EXR_ATTR_V2I: retval += sizeof (*(cur->v2i)); break;
            case EXR_ATTR_V2F: retval += sizeof (*(cur->v2f)); break;
            case EXR_ATTR_V2D: retval += sizeof (*(cur->v2d)); break;
            case EXR_ATTR_V3I: retval += sizeof (*(cur->v3i)); break;
            case EXR_ATTR_V3F: retval += sizeof (*(cur->v3f)); break;
            case EXR_ATTR_V3D: retval += sizeof (*(cur->v3d)); break;
            case EXR_ATTR_DEEP_IMAGE_STATE: retval += sizeof (uint8_t); break;
            case EXR_ATTR_OPAQUE:
                if (cur->opaque->packed_data)
                    retval += (size_t) cur->opaque->size;
                else if (cur->opaque->unpacked_data)
                {
                    int32_t sz = 0;
                    rv =
                        exr_attr_opaquedata_pack (ctxt, cur->opaque, &sz, NULL);
                    if (rv != EXR_ERR_SUCCESS) return rv;

                    retval += (size_t) sz;
                }
                break;
            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default:
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Invalid / unhandled type '%s' for attribute '%s', unable to compute size",
                    cur->type_name,
                    cur->name);
        }
    }

    *out = retval;
    return rv;
}